

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_datanode.c
# Opt level: O0

SUNErrCode SUNDataNode_CreateEmpty(SUNContext_conflict sunctx,SUNDataNode *node_out)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  undefined8 *in_RSI;
  undefined8 in_RDI;
  SUNDataNode_Ops ops;
  SUNDataNode self;
  SUNContext_conflict sunctx_local_scope_;
  
  puVar1 = (undefined8 *)malloc(0x20);
  puVar2 = (undefined8 *)malloc(0x78);
  *puVar2 = 0;
  puVar2[1] = 0;
  puVar2[2] = 0;
  puVar2[3] = 0;
  puVar2[4] = 0;
  puVar2[6] = 0;
  puVar2[8] = 0;
  puVar2[10] = 0;
  puVar2[0xc] = 0;
  puVar2[0xe] = 0;
  *(undefined4 *)(puVar1 + 1) = 0;
  *puVar1 = puVar2;
  puVar1[2] = 0;
  puVar1[3] = in_RDI;
  *in_RSI = puVar1;
  return 0;
}

Assistant:

SUNErrCode SUNDataNode_CreateEmpty(SUNContext sunctx, SUNDataNode* node_out)
{
  SUNFunctionBegin(sunctx);

  SUNDataNode self;
  self = (SUNDataNode)malloc(sizeof(*self));
  SUNAssert(self, SUN_ERR_MEM_FAIL);

  SUNDataNode_Ops ops;
  ops = (SUNDataNode_Ops)malloc(sizeof(*ops));
  SUNAssert(self, SUN_ERR_MEM_FAIL);

  ops->haschildren = NULL;
  ops->isleaf      = NULL;
  ops->islist      = NULL;
  ops->isobject    = NULL;
  ops->addchild    = NULL;
  ops->getchild    = NULL;
  ops->removechild = NULL;
  ops->getdata     = NULL;
  ops->setdata     = NULL;
  ops->destroy     = NULL;

  self->dtype   = 0;
  self->ops     = ops;
  self->content = NULL;
  self->sunctx  = sunctx;

  *node_out = self;
  return SUN_SUCCESS;
}